

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

int __thiscall
unodb::detail::
basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::init(basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  node_header nVar1;
  node_header *ptr_;
  uint uVar2;
  int extraout_EAX;
  ulong uVar3;
  uintptr_t uVar4;
  long in_RCX;
  long in_RDX;
  int iVar5;
  uint in_R8D;
  ulong uVar6;
  undefined1 local_28 [8];
  db_inode_reclaimable_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  
  iVar5 = 0;
  uVar2 = 1;
  do {
    uVar3 = (ulong)(uVar2 - 1);
    uVar6 = (ulong)*(byte *)(in_RDX + 9 + uVar3);
    if (uVar6 == 0xff) {
      (this->children)._M_elems[uVar3].value.tagged_ptr = 0;
    }
    else {
      (this->children)._M_elems[uVar3].value.tagged_ptr = *(uintptr_t *)(in_RDX + 0x120 + uVar6 * 8)
      ;
      iVar5 = iVar5 + 1;
      if (iVar5 == 0x30) {
        for (uVar3 = (ulong)uVar2; (uint)uVar3 < 0x100; uVar3 = uVar3 + 1) {
          (this->children)._M_elems[uVar3].value.tagged_ptr = 0;
        }
        ptr_ = *(node_header **)(in_RCX + 8);
        nVar1 = ptr_[(ulong)in_R8D + 8];
        local_28 = (undefined1  [8])ctx;
        if ((this->children)._M_elems[(byte)nVar1].value.tagged_ptr == 0) {
          *(undefined8 *)(in_RCX + 8) = 0;
          uVar4 = basic_node_ptr<unodb::detail::node_header>::tag_ptr(ptr_,LEAF);
          (this->children)._M_elems[(byte)nVar1].value.tagged_ptr = uVar4;
          std::
          unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)local_28);
          return extraout_EAX;
        }
        __assert_fail("children[key_byte] == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0xa74,
                      "void unodb::detail::basic_inode_256<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(db_type &, inode48_type &__restrict, db_leaf_unique_ptr, tree_depth_type) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                     );
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

constexpr void init(db_type &db_instance,
                      inode48_type &__restrict source_node,
                      db_leaf_unique_ptr child,
                      tree_depth_type depth) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode48_type>(
            &source_node, db_instance)};
    unsigned children_copied = 0;
    unsigned i = 0;
    while (true) {
      const auto children_i = source_node.child_indexes[i].load();
      if (children_i == inode48_type::empty_child) {
        children[i] = node_ptr{nullptr};
      } else {
        children[i] = source_node.children.pointer_array[children_i].load();
        ++children_copied;
        if (children_copied == inode48_type::capacity) break;
      }
      ++i;
    }

    ++i;
    for (; i < basic_inode_256::capacity; ++i) children[i] = node_ptr{nullptr};

    const auto key_byte = static_cast<uint8_t>(child->get_key_view()[depth]);
    UNODB_DETAIL_ASSERT(children[key_byte] == nullptr);
    children[key_byte] = node_ptr{child.release(), node_type::LEAF};
  }